

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::minusSign(AffixTokenMatcherWarehouse *this)

{
  UnicodeString *src;
  MinusSignMatcher local_78;
  
  MinusSignMatcher::MinusSignMatcher(&local_78,this->fSetupData->dfs,true);
  src = &local_78.super_SymbolMatcher.fString;
  UnicodeString::moveFrom(&(this->fMinusSign).super_SymbolMatcher.fString,src);
  (this->fMinusSign).super_SymbolMatcher.fUniSet = local_78.super_SymbolMatcher.fUniSet;
  (this->fMinusSign).fAllowTrailing = local_78.fAllowTrailing;
  local_78.super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003f4ef8;
  UnicodeString::~UnicodeString(src);
  NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)&local_78);
  return (NumberParseMatcher *)&this->fMinusSign;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::minusSign() {
    return fMinusSign = {fSetupData->dfs, true};
}